

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

void __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
::emplace<helics::route_id&,helics::ActionMessage>
          (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
           *this,route_id *args,ActionMessage *args_1)

{
  bool bVar1;
  vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
  *this_00;
  bool expEmpty;
  unique_lock<std::mutex> pushLock;
  unique_lock<std::mutex> pullLock;
  
  std::unique_lock<std::mutex>::unique_lock(&pushLock,(mutex_type *)this);
  this_00 = (vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
             *)(this + 0x50);
  if (*(long *)(this + 0x50) == *(long *)(this + 0x58)) {
    expEmpty = true;
    bVar1 = CLI::std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)(this + 0x80),&expEmpty,false,seq_cst);
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock(&pushLock);
      std::unique_lock<std::mutex>::unique_lock(&pullLock,(mutex_type *)(this + 0x28));
      LOCK();
      this[0x80] = (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                    )0x0;
      UNLOCK();
      if (*(long *)(this + 0x68) == *(long *)(this + 0x70)) {
        this_00 = (vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
                   *)(this + 0x68);
      }
      else {
        std::unique_lock<std::mutex>::lock(&pushLock);
      }
      std::
      vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
      ::emplace_back<helics::route_id&,helics::ActionMessage>(this_00,args,args_1);
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock(&pullLock);
    }
    else {
      std::
      vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
      ::emplace_back<helics::route_id&,helics::ActionMessage>(this_00,args,args_1);
      expEmpty = true;
      bVar1 = CLI::std::atomic<bool>::compare_exchange_strong
                        ((atomic<bool> *)(this + 0x80),&expEmpty,false,seq_cst);
      if (bVar1) {
        std::condition_variable::notify_all();
      }
    }
  }
  else {
    std::
    vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
    ::emplace_back<helics::route_id&,helics::ActionMessage>(this_00,args,args_1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&pushLock);
  return;
}

Assistant:

void emplace(Args&&... args)
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                bool expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    // release the push lock so we don't get a potential
                    // deadlock condition
                    pushLock.unlock();
                    std::unique_lock<MUTEX> pullLock(
                        m_pullLock);  // first pullLock
                    queueEmptyFlag = false;  // need to set the flag again after
                                             // we get the lock
                    if (pullElements.empty()) {
                        pullElements.emplace_back(std::forward<Args>(args)...);
                    } else {
                        pushLock.lock();
                        pushElements.emplace_back(std::forward<Args>(args)...);
                    }

                    condition.notify_all();
                    return;
                } else {
                    pushElements.emplace_back(std::forward<Args>(args)...);
                    expEmpty = true;
                    if (queueEmptyFlag.compare_exchange_strong(
                            expEmpty, false)) {
                        condition.notify_all();
                    }
                    return;
                }
            }
            pushElements.emplace_back(std::forward<Args>(args)...);
        }